

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O1

void writeTiledRgbaRIP1(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int xMax;
  int yMax;
  undefined8 uVar4;
  int yLevel;
  int yLevel_00;
  int iVar5;
  int xLevel;
  Array2D<Imf_3_2::Rgba> pixels;
  undefined8 local_50;
  TiledRgbaOutputFile out;
  
  local_50 = 0;
  uVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,width,height,tileWidth,
             tileHeight,2,0,0xf,&local_50,0,3,uVar4);
  pixels._sizeX = (long)height;
  pixels._sizeY = (long)width;
  pixels._data = (Rgba *)operator_new__(-(ulong)((ulong)(pixels._sizeX * pixels._sizeY) >> 0x3d != 0
                                                ) | pixels._sizeX * pixels._sizeY * 8);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pixels._data,1);
  yLevel_00 = 0;
  while( true ) {
    iVar1 = Imf_3_2::TiledRgbaOutputFile::numYLevels();
    if (iVar1 <= yLevel_00) break;
    iVar1 = 0;
    while( true ) {
      iVar2 = Imf_3_2::TiledRgbaOutputFile::numXLevels();
      if (iVar2 <= iVar1) break;
      iVar5 = (int)&out;
      iVar2 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar5);
      iVar3 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar5);
      xMax = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar5);
      yMax = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar5);
      drawImage5(&pixels,iVar2,iVar3,0,xMax,0,yMax,iVar1,yLevel_00);
      iVar2 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar5);
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar5);
      Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar5,0,iVar2 + -1,0,iVar3 + -1,iVar1);
      iVar1 = iVar1 + 1;
    }
    yLevel_00 = yLevel_00 + 1;
  }
  if (pixels._data != (Rgba *)0x0) {
    operator_delete__(pixels._data);
  }
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaRIP1 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with ripmap levels using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        RIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (height, width);
    out.setFrameBuffer (&pixels[0][0], 1, width);

    for (int yLevel = 0; yLevel < out.numYLevels (); ++yLevel)
    {
        for (int xLevel = 0; xLevel < out.numXLevels (); ++xLevel)
        {
            drawImage5 (
                pixels,
                out.levelWidth (xLevel),
                out.levelHeight (yLevel),
                0,
                out.levelWidth (xLevel),
                0,
                out.levelHeight (yLevel),
                xLevel,
                yLevel);

            out.writeTiles (
                0,
                out.numXTiles (xLevel) - 1,
                0,
                out.numYTiles (yLevel) - 1,
                xLevel,
                yLevel);
        }
    }
}